

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::visibility_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,e_struct_type struct_type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (struct_type - T_ARGS < 2) {
    pcVar2 = "";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "pub ";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::visibility_qualifier(t_rs_generator::e_struct_type struct_type) {
  switch(struct_type) {
  case t_rs_generator::T_ARGS:
  case t_rs_generator::T_RESULT:
    return "";
  default:
    return "pub ";
  }
}